

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::PlainGatherInt2DArray::VerifyCompute(PlainGatherInt2DArray *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  Vector<int,_4> *this_00;
  float *pfVar9;
  uint *puVar10;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<int,_4> local_30;
  Vector<int,_4> *local_20;
  IVec4 *data;
  PlainGatherInt2DArray *this_local;
  
  data = (IVec4 *)this;
  this_00 = (Vector<int,_4> *)
            glu::CallLogWrapper::glMapBufferRange
                      (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x90d2,0,0x10,1);
  local_20 = this_00;
  tcu::Vector<int,_4>::Vector(&local_30,3,7,0xb,0xf);
  bVar8 = tcu::Vector<int,_4>::operator!=(this_00,&local_30);
  if (bVar8) {
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (&local_40);
    pfVar9 = tcu::Vector<float,_4>::x(&local_40);
    fVar1 = *pfVar9;
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (&local_50);
    pfVar9 = tcu::Vector<float,_4>::y(&local_50);
    fVar2 = *pfVar9;
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (&local_60);
    pfVar9 = tcu::Vector<float,_4>::z(&local_60);
    fVar3 = *pfVar9;
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
              (&local_70);
    pfVar9 = tcu::Vector<float,_4>::w(&local_70);
    fVar4 = *pfVar9;
    puVar10 = (uint *)tcu::Vector<int,_4>::x(local_20);
    uVar5 = *puVar10;
    puVar10 = (uint *)tcu::Vector<int,_4>::y(local_20);
    uVar6 = *puVar10;
    puVar10 = (uint *)tcu::Vector<int,_4>::z(local_20);
    uVar7 = *puVar10;
    puVar10 = (uint *)tcu::Vector<int,_4>::w(local_20);
    anon_unknown_0::Output
              ("Expected %d, %d, %d, %d, got: %d, %d, %d, %d",(double)fVar1,(double)fVar2,
               (double)fVar3,(double)fVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)*puVar10);
    this_local = (PlainGatherInt2DArray *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (PlainGatherInt2DArray *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long VerifyCompute()
	{
		IVec4* data;
		data = static_cast<IVec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
		if (data[0] != IVec4(3, 7, 11, 15))
		{
			Output("Expected %d, %d, %d, %d, got: %d, %d, %d, %d", Expected().x(), Expected().y(), Expected().z(),
				   Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}